

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeSetSpillSize(Btree *p,int mxPage)

{
  BtShared *pBVar1;
  PCache *p_00;
  int iVar2;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  p_00 = pBVar1->pPager->pPCache;
  if (mxPage == 0) {
    mxPage = p_00->szSpill;
  }
  else {
    if (mxPage < 0) {
      mxPage = (int)(((long)mxPage * -0x400) / ((long)p_00->szExtra + (long)p_00->szPage));
    }
    p_00->szSpill = mxPage;
  }
  iVar2 = numberOfCachePages(p_00);
  if (iVar2 <= mxPage) {
    iVar2 = mxPage;
  }
  sqlite3BtreeLeave(p);
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetSpillSize(Btree *p, int mxPage){
  BtShared *pBt = p->pBt;
  int res;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  res = sqlite3PagerSetSpillsize(pBt->pPager, mxPage);
  sqlite3BtreeLeave(p);
  return res;
}